

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_json_cursor<std::__cxx11::string&>
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc,type *param_6)

{
  basic_staj_visitor<char> *in_RCX;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RDX;
  string *in_RSI;
  basic_staj_cursor<char> *in_RDI;
  allocator<char> *in_stack_000000a8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_000000b0;
  basic_json_decode_options<char> *in_stack_000000b8;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_000000c0;
  json_source_adaptor<jsoncons::string_source<char>_> *in_stack_ffffffffffffff70;
  basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffb0;
  string_view_type in_stack_ffffffffffffffb8;
  
  ser_context::ser_context((ser_context *)(in_RDI + 0x31));
  basic_staj_cursor<char>::basic_staj_cursor(in_RDI);
  in_RDI->_vptr_basic_staj_cursor = (_func_int **)(vtable + 0x18);
  in_RDI[0x31]._vptr_basic_staj_cursor = (_func_int **)(vtable + 0xb8);
  json_source_adaptor<jsoncons::string_source<char>_>::json_source_adaptor
            (in_stack_ffffffffffffff70);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)in_RCX,in_RDX);
  basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x9642af);
  basic_staj_visitor<char>::basic_staj_visitor(in_RCX);
  *(undefined1 *)&in_RDI[0x30]._vptr_basic_staj_cursor = 0;
  basic_json_parser<char,_std::allocator<char>_>::cursor_mode
            ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 5),true);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
  initialize_with_string_view(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

basic_json_cursor(Sourceable&& source, 
        const basic_json_decode_options<CharT>& options = basic_json_decode_options<CharT>(),
        std::function<bool(json_errc,const ser_context&)> err_handler = default_json_parsing(),
        const Allocator& alloc = Allocator(),
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options, err_handler, alloc)
    {
        parser_.cursor_mode(true);
        initialize_with_string_view(std::forward<Sourceable>(source));
    }